

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O3

Vec_Int_t * Abc_NtkMapGiaIntoNameId(Abc_Ntk_t *pNetlist,Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long *plVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  size_t __size;
  
  pVVar6 = (Vec_Int_t *)calloc(1,0x10);
  if (pGia == (Gia_Man_t *)0x0) {
    piVar7 = &pAig->vObjs->nSize;
  }
  else {
    piVar7 = &pGia->nObjs;
  }
  iVar1 = *piVar7;
  if ((long)iVar1 < 1) {
    piVar7 = (int *)0x0;
  }
  else {
    __size = (long)iVar1 << 2;
    piVar7 = (int *)malloc(__size);
    pVVar6->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar6->nCap = iVar1;
    memset(piVar7,0xff,__size);
  }
  pVVar6->nSize = iVar1;
  pVVar2 = pNetlist->vObjs;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar8];
      if ((((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 6)) &&
          (lVar5 = *(long *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                      (long)*(int *)plVar4[4] * 8) + 0x40), lVar5 != 0)) &&
         (((uVar10 = *(ulong *)(lVar5 + 0x40) & 0xfffffffffffffffe, uVar10 != 0 &&
           (uVar10 = *(ulong *)(uVar10 + 0x40) & 0xfffffffffffffffe, uVar10 != 0)) &&
          ((*(byte *)(uVar10 + 0x18) & 7) != 0)))) {
        if (pGia == (Gia_Man_t *)0x0) {
          uVar9 = *(uint *)(uVar10 + 0x24);
          if ((int)uVar9 < 0) goto LAB_002a8b80;
        }
        else {
          if ((int)*(uint *)(uVar10 + 0x28) < 0) goto LAB_002a8b9f;
          uVar9 = *(uint *)(uVar10 + 0x28) >> 1;
        }
        if (iVar1 <= (int)uVar9) goto LAB_002a8b80;
        piVar7[uVar9] = (int)plVar4[2];
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  pVVar2 = pNetlist->vCos;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar8];
      if (((plVar4[8] != 0) &&
          (uVar10 = *(ulong *)(plVar4[8] + 0x40) & 0xfffffffffffffffe, uVar10 != 0)) &&
         ((uVar10 = *(ulong *)(uVar10 + 0x40) & 0xfffffffffffffffe, uVar10 != 0 &&
          ((*(byte *)(uVar10 + 0x18) & 7) != 0)))) {
        if (pGia == (Gia_Man_t *)0x0) {
          uVar9 = *(uint *)(uVar10 + 0x24);
          if ((int)uVar9 < 0) goto LAB_002a8b80;
        }
        else {
          if ((int)*(uint *)(uVar10 + 0x28) < 0) goto LAB_002a8b9f;
          uVar9 = *(uint *)(uVar10 + 0x28) >> 1;
        }
        if (iVar1 <= (int)uVar9) goto LAB_002a8b80;
        piVar7[uVar9] =
             *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[4] * 8) + 0x10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  pVVar2 = pNetlist->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      plVar4 = (long *)ppvVar3[lVar8];
      if ((((plVar4[8] != 0) &&
           (uVar10 = *(ulong *)(plVar4[8] + 0x40) & 0xfffffffffffffffe, uVar10 != 0)) &&
          (uVar10 = *(ulong *)(uVar10 + 0x40) & 0xfffffffffffffffe, uVar10 != 0)) &&
         ((*(byte *)(uVar10 + 0x18) & 7) != 0)) {
        if (pGia == (Gia_Man_t *)0x0) {
          uVar9 = *(uint *)(uVar10 + 0x24);
          if ((int)uVar9 < 0) {
LAB_002a8b80:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
        }
        else {
          if ((int)*(uint *)(uVar10 + 0x28) < 0) {
LAB_002a8b9f:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10c,"int Abc_Lit2Var(int)");
          }
          uVar9 = *(uint *)(uVar10 + 0x28) >> 1;
        }
        if (iVar1 <= (int)uVar9) goto LAB_002a8b80;
        piVar7[uVar9] =
             *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[6] * 8) + 0x10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Abc_NtkMapGiaIntoNameId( Abc_Ntk_t * pNetlist, Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Vec_Int_t * vId2Name;
    Abc_Obj_t * pNet, * pNode, * pAnd;
    Aig_Obj_t * pObjAig;
    int i;
    vId2Name = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Name, pGia ? Gia_ManObjNum(pGia) : Aig_ManObjNumMax(pAig), ~0 );
    // copy all names
    Abc_NtkForEachNet( pNetlist, pNet, i )
    {
        pNode = Abc_ObjFanin0(pNet)->pCopy; 
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    // overwrite CO names
    Abc_NtkForEachCo( pNetlist, pNode, i )
    {
        pNet = Abc_ObjFanin0(pNode);
        pNode = pNode->pCopy;
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    // overwrite CI names
    Abc_NtkForEachCi( pNetlist, pNode, i )
    {
        pNet = Abc_ObjFanout0(pNode);
        pNode = pNode->pCopy;
        if ( pNode && (pAnd = Abc_ObjRegular(pNode->pCopy)) && 
            (pObjAig = (Aig_Obj_t *)Abc_ObjRegular(pAnd->pCopy)) && 
             Aig_ObjType(pObjAig) != AIG_OBJ_NONE )
        {
            if ( pGia == NULL )
                Vec_IntWriteEntry( vId2Name, Aig_ObjId(pObjAig), Abc_ObjId(pNet) );
            else
                Vec_IntWriteEntry( vId2Name, Abc_Lit2Var(pObjAig->iData), Abc_ObjId(pNet) );
        }
    }
    return vId2Name;
}